

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_utf_decode(char *c,nk_rune *u,int clen)

{
  nk_rune nVar1;
  int in_EDX;
  nk_rune *in_RSI;
  char *in_RDI;
  nk_rune udecoded;
  int type;
  int len;
  int j;
  int i;
  nk_rune local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  nk_rune *local_18;
  char *local_10;
  int local_4;
  
  local_2c = 0;
  if ((in_RDI == (char *)0x0) || (in_RSI == (nk_rune *)0x0)) {
    local_4 = 0;
  }
  else if (in_EDX == 0) {
    local_4 = 0;
  }
  else {
    *in_RSI = 0xfffd;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_30 = nk_utf_decode_byte(*in_RDI,&local_28);
    if ((local_28 < 1) || (3 < local_28)) {
      local_4 = 1;
    }
    else {
      local_24 = 1;
      for (local_20 = 1; local_20 < local_1c && local_24 < local_28; local_20 = local_20 + 1) {
        nVar1 = nk_utf_decode_byte(local_10[local_20],&local_2c);
        local_30 = local_30 << 6 | nVar1;
        if (local_2c != 0) {
          return local_24;
        }
        local_24 = local_24 + 1;
      }
      if (local_24 < local_28) {
        local_4 = 0;
      }
      else {
        *local_18 = local_30;
        nk_utf_validate(local_18,local_28);
        local_4 = local_28;
      }
    }
  }
  return local_4;
}

Assistant:

NK_API int
nk_utf_decode(const char *c, nk_rune *u, int clen)
{
int i, j, len, type=0;
nk_rune udecoded;

NK_ASSERT(c);
NK_ASSERT(u);

if (!c || !u) return 0;
if (!clen) return 0;
*u = NK_UTF_INVALID;

udecoded = nk_utf_decode_byte(c[0], &len);
if (!NK_BETWEEN(len, 1, NK_UTF_SIZE))
return 1;

for (i = 1, j = 1; i < clen && j < len; ++i, ++j) {
udecoded = (udecoded << 6) | nk_utf_decode_byte(c[i], &type);
if (type != 0)
return j;
}
if (j < len)
return 0;
*u = udecoded;
nk_utf_validate(u, len);
return len;
}